

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3_free_table(char **azResult)

{
  char *pcVar1;
  char **p;
  int local_14;
  int n;
  int i;
  char **azResult_local;
  
  if (azResult != (char **)0x0) {
    p = azResult + -1;
    pcVar1 = *p;
    for (local_14 = 1; local_14 < (int)pcVar1; local_14 = local_14 + 1) {
      if (p[local_14] != (char *)0x0) {
        sqlite3_free(p[local_14]);
      }
    }
    sqlite3_free(p);
  }
  return;
}

Assistant:

SQLITE_API void sqlite3_free_table(
  char **azResult            /* Result returned from sqlite3_get_table() */
){
  if( azResult ){
    int i, n;
    azResult--;
    assert( azResult!=0 );
    n = SQLITE_PTR_TO_INT(azResult[0]);
    for(i=1; i<n; i++){ if( azResult[i] ) sqlite3_free(azResult[i]); }
    sqlite3_free(azResult);
  }
}